

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<true,_true,_false>::pop_block_(DaTrie<true,_true,_false> *this)

{
  DaTrie<true,_true,_false> *in_RDI;
  uint32_t i_1;
  uint32_t i;
  uint32_t block_pos;
  uint32_t in_stack_ffffffffffffffdc;
  uint local_14;
  uint local_10;
  
  num_blocks((DaTrie<true,_true,_false> *)0x167d08);
  pop_block_(in_RDI,in_stack_ffffffffffffffdc,
             (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)0x167d24);
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::pop_back
              ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)0x167d40);
  }
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::pop_back
              ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)0x167d6d);
  }
  std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::pop_back
            ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)0x167d88);
  in_RDI->bc_emps_ = in_RDI->bc_emps_ - 0x100;
  return;
}

Assistant:

void pop_block_() {
    assert(!bc_.empty());

    auto block_pos = num_blocks() - 1;
    pop_block_(block_pos, blocks_);

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.pop_back();
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.pop_back();
      }
    }

    blocks_.pop_back();
    bc_emps_ -= BLOCK_SIZE;
  }